

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageViewTests.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::anon_unknown_1::ImageViewTest::initPrograms
          (ImageViewTest *this,SourceCollections *sourceCollections)

{
  VkImageViewType VVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  bool bVar6;
  CompressedTexFormat format;
  TextureChannelClass TVar7;
  TextureFormat TVar8;
  ostream *poVar9;
  ProgramSources *pPVar10;
  char *pcVar11;
  char *pcVar12;
  VkComponentMapping componentMapping;
  VkComponentMapping componentMapping_00;
  Vec4 swizzledBias;
  Vec4 swizzledScale;
  Vec4 lookupBias;
  Vec4 lookupScale;
  ostringstream fragmentSrc;
  ostringstream vertexSrc;
  allocator<char> local_539;
  string local_538;
  string local_518;
  Vec4 local_4f8;
  Vec4 local_4e8;
  Vector<float,_4> local_4d8;
  Vector<float,_4> local_4c8;
  Vector<float,_4> local_4b8;
  Vector<float,_4> local_4a8;
  undefined1 local_498 [376];
  ostringstream local_320 [376];
  ostringstream local_1a8 [376];
  ChannelType channelType;
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__cxx11::ostringstream::ostringstream(local_320);
  bVar6 = ::vk::isCompressedFormat(this->m_imageFormat);
  if (bVar6) {
    format = ::vk::mapVkCompressedFormat(this->m_imageFormat);
    TVar8 = tcu::getUncompressedFormat(format);
    channelType = TVar8.type;
  }
  else {
    TVar8 = ::vk::mapVkFormat(this->m_imageFormat);
    channelType = TVar8.type;
  }
  tcu::Vector<float,_4>::Vector(&local_4c8);
  tcu::Vector<float,_4>::Vector(&local_4d8);
  getLookupScaleBias(this->m_imageFormat,&local_4c8,&local_4d8);
  tcu::Vector<float,_4>::Vector(&local_4a8,&local_4c8);
  uVar2 = (this->m_componentMapping).r;
  uVar4 = (this->m_componentMapping).g;
  componentMapping.a = uVar4;
  componentMapping.b = uVar2;
  componentMapping._0_8_ = &local_4a8;
  swizzle(&local_4e8,componentMapping);
  tcu::Vector<float,_4>::Vector(&local_4b8,&local_4d8);
  uVar3 = (this->m_componentMapping).r;
  uVar5 = (this->m_componentMapping).g;
  componentMapping_00.a = uVar5;
  componentMapping_00.b = uVar3;
  componentMapping_00._0_8_ = &local_4b8;
  swizzle(&local_4f8,componentMapping_00);
  if ((ulong)this->m_imageViewType < 7) {
    pcVar12 = &DAT_009586f0 + *(int *)(&DAT_009586f0 + (ulong)this->m_imageViewType * 4);
  }
  else {
    pcVar12 = (char *)0x0;
  }
  poVar9 = std::operator<<((ostream *)local_1a8,"#version 440\n");
  poVar9 = std::operator<<(poVar9,"layout(location = 0) in vec4 position;\n");
  poVar9 = std::operator<<(poVar9,"layout(location = 1) in vec4 texCoords;\n");
  poVar9 = std::operator<<(poVar9,"layout(location = 0) out highp vec4 vtxTexCoords;\n");
  poVar9 = std::operator<<(poVar9,"out gl_PerVertex {\n");
  poVar9 = std::operator<<(poVar9,"\tvec4 gl_Position;\n");
  poVar9 = std::operator<<(poVar9,"};\n");
  poVar9 = std::operator<<(poVar9,"void main (void)\n");
  poVar9 = std::operator<<(poVar9,"{\n");
  poVar9 = std::operator<<(poVar9,"\tgl_Position = position;\n");
  poVar9 = std::operator<<(poVar9,"\tvtxTexCoords = texCoords;\n");
  std::operator<<(poVar9,"}\n");
  poVar9 = std::operator<<((ostream *)local_320,"#version 440\n");
  poVar9 = std::operator<<(poVar9,"layout(set = 0, binding = 0) uniform highp ");
  VVar1 = this->m_imageViewType;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
  TVar7 = tcu::getTextureChannelClass(channelType);
  if (TVar7 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    pcVar11 = "u";
  }
  else {
    TVar7 = tcu::getTextureChannelClass(channelType);
    if (TVar7 != TEXTURECHANNELCLASS_SIGNED_INTEGER) goto LAB_004ea671;
    pcVar11 = "i";
  }
  std::operator<<((ostream *)local_498,pcVar11);
LAB_004ea671:
  if (VVar1 < VK_IMAGE_VIEW_TYPE_LAST) {
    std::operator<<((ostream *)local_498,&DAT_0095870c + *(int *)(&DAT_0095870c + (ulong)VVar1 * 4))
    ;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
  poVar9 = std::operator<<(poVar9,(string *)&local_538);
  poVar9 = std::operator<<(poVar9," texSampler;\n");
  poVar9 = std::operator<<(poVar9,"layout(location = 0) in highp vec4 vtxTexCoords;\n");
  poVar9 = std::operator<<(poVar9,"layout(location = 0) out highp vec4 fragColor;\n");
  poVar9 = std::operator<<(poVar9,"void main (void)\n");
  poVar9 = std::operator<<(poVar9,"{\n");
  std::operator<<(poVar9,"\tfragColor = ");
  std::__cxx11::string::~string((string *)&local_538);
  if (this->m_samplerLod <= 0.0) {
    poVar9 = std::operator<<((ostream *)local_320,"texture(texSampler, vtxTexCoords.");
    poVar9 = std::operator<<(poVar9,pcVar12);
    poVar9 = std::operator<<(poVar9,")");
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xfffffefb | 4;
  }
  else {
    poVar9 = std::operator<<((ostream *)local_320,"textureLod(texSampler, vtxTexCoords.");
    poVar9 = std::operator<<(poVar9,pcVar12);
    poVar9 = std::operator<<(poVar9,", ");
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xfffffefb | 4;
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->m_samplerLod);
    std::operator<<(poVar9,")");
  }
  poVar9 = std::operator<<((ostream *)local_320," * vec4");
  *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
       *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xfffffefb | 0x100;
  poVar9 = tcu::operator<<(poVar9,&local_4e8);
  poVar9 = std::operator<<(poVar9," + vec4");
  poVar9 = tcu::operator<<(poVar9,&local_4f8);
  poVar9 = std::operator<<(poVar9,";\n");
  std::operator<<(poVar9,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_538,"tex_vert",&local_539);
  pPVar10 = ::vk::ProgramCollection<glu::ProgramSources>::add
                      (&sourceCollections->glslSources,&local_538);
  std::__cxx11::stringbuf::str();
  glu::VertexSource::VertexSource((VertexSource *)local_498,&local_518);
  glu::ProgramSources::operator<<(pPVar10,(ShaderSource *)local_498);
  std::__cxx11::string::~string((string *)(local_498 + 8));
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_538,"tex_frag",&local_539);
  pPVar10 = ::vk::ProgramCollection<glu::ProgramSources>::add
                      (&sourceCollections->glslSources,&local_538);
  std::__cxx11::stringbuf::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)local_498,&local_518);
  glu::ProgramSources::operator<<(pPVar10,(ShaderSource *)local_498);
  std::__cxx11::string::~string((string *)(local_498 + 8));
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return;
}

Assistant:

void ImageViewTest::initPrograms (SourceCollections& sourceCollections) const
{
	std::ostringstream				vertexSrc;
	std::ostringstream				fragmentSrc;
	const char*						texCoordSwizzle	= DE_NULL;
	const tcu::TextureFormat		format			= (isCompressedFormat(m_imageFormat)) ? tcu::getUncompressedFormat(mapVkCompressedFormat(m_imageFormat))
																						  : mapVkFormat(m_imageFormat);

	tcu::Vec4						lookupScale;
	tcu::Vec4						lookupBias;

	getLookupScaleBias(m_imageFormat, lookupScale, lookupBias);

	tcu::Vec4						swizzledScale	= swizzle(lookupScale, m_componentMapping);
	tcu::Vec4						swizzledBias	= swizzle(lookupBias, m_componentMapping);

	switch (m_imageViewType)
	{
		case VK_IMAGE_VIEW_TYPE_1D:
			texCoordSwizzle = "x";
			break;
		case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
		case VK_IMAGE_VIEW_TYPE_2D:
			texCoordSwizzle = "xy";
			break;
		case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
		case VK_IMAGE_VIEW_TYPE_3D:
		case VK_IMAGE_VIEW_TYPE_CUBE:
			texCoordSwizzle = "xyz";
			break;
		case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
			texCoordSwizzle = "xyzw";
			break;
		default:
			DE_ASSERT(false);
			break;
	}

	vertexSrc << "#version 440\n"
			  << "layout(location = 0) in vec4 position;\n"
			  << "layout(location = 1) in vec4 texCoords;\n"
			  << "layout(location = 0) out highp vec4 vtxTexCoords;\n"
			  << "out gl_PerVertex {\n"
			  << "	vec4 gl_Position;\n"
			  << "};\n"
			  << "void main (void)\n"
			  << "{\n"
			  << "	gl_Position = position;\n"
			  << "	vtxTexCoords = texCoords;\n"
			  << "}\n";

	fragmentSrc << "#version 440\n"
				<< "layout(set = 0, binding = 0) uniform highp " << getGlslSamplerType(format, m_imageViewType) << " texSampler;\n"
				<< "layout(location = 0) in highp vec4 vtxTexCoords;\n"
				<< "layout(location = 0) out highp vec4 fragColor;\n"
				<< "void main (void)\n"
				<< "{\n"
				<< "	fragColor = ";

	if (m_samplerLod > 0.0f)
		fragmentSrc << "textureLod(texSampler, vtxTexCoords." << texCoordSwizzle << ", " << std::fixed <<  m_samplerLod << ")";
	else
		fragmentSrc << "texture(texSampler, vtxTexCoords." << texCoordSwizzle << ")" << std::fixed;

	fragmentSrc << " * vec4" << std::scientific << swizzledScale << " + vec4" << swizzledBias << ";\n"
				<< "}\n";

	sourceCollections.glslSources.add("tex_vert") << glu::VertexSource(vertexSrc.str());
	sourceCollections.glslSources.add("tex_frag") << glu::FragmentSource(fragmentSrc.str());
}